

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall amrex::AmrMesh::AmrMesh(AmrMesh *this)

{
  undefined8 *in_RDI;
  AmrInfo *in_stack_00000060;
  Vector<int,_std::allocator<int>_> n_cell_in;
  int max_level_in;
  int *in_stack_000000e0;
  int in_stack_000000ec;
  RealBox *in_stack_000000f0;
  int in_stack_00000704;
  RealBox *in_stack_00000708;
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_00000710;
  Vector<int,_std::allocator<int>_> *in_stack_00000718;
  int in_stack_00000724;
  AmrMesh *in_stack_00000728;
  int *in_stack_00000b70;
  allocator_type *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  size_type in_stack_ffffffffffffff78;
  Vector<int,_std::allocator<int>_> *this_00;
  
  AmrInfo::AmrInfo(in_stack_00000060);
  *in_RDI = &PTR__AmrMesh_018039b8;
  this_00 = (Vector<int,_std::allocator<int>_> *)(in_RDI + 0x13);
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x10d0a45);
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::Vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             0x10d0a5b);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x10d0a71);
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)((long)in_RDI + 0xe4) = 0;
  Geometry::Setup(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
  std::allocator<int>::allocator((allocator<int> *)0x10d0abd);
  Vector<int,_std::allocator<int>_>::vector
            (this_00,in_stack_ffffffffffffff78,
             (value_type *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  std::allocator<int>::~allocator((allocator<int> *)0x10d0ae2);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x10d0b0d);
  InitAmrMesh(in_stack_00000728,in_stack_00000724,in_stack_00000718,in_stack_00000710,
              in_stack_00000708,in_stack_00000704,in_stack_00000b70);
  Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::~Vector
            ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)0x10d0b46);
  Vector<int,_std::allocator<int>_>::~Vector((Vector<int,_std::allocator<int>_> *)0x10d0b50);
  return;
}

Assistant:

AmrMesh::AmrMesh ()
{
    Geometry::Setup();
    int max_level_in = -1;
    Vector<int> n_cell_in(AMREX_SPACEDIM, -1);
    InitAmrMesh(max_level_in,n_cell_in);
}